

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dzsum1.c
# Opt level: O0

double dzsum1_slu(int *n,doublecomplex *cx,int *incx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  int *local_38;
  double stemp;
  int nincx;
  int i;
  int *incx_local;
  doublecomplex *cx_local;
  int *n_local;
  
  local_38 = (int *)0x0;
  if (*n < 1) {
    n_local = (int *)0x0;
  }
  else if (*incx == 1) {
    for (stemp._4_4_ = 1; stemp._4_4_ <= *n; stemp._4_4_ = stemp._4_4_ + 1) {
      dVar4 = z_abs(cx + (stemp._4_4_ + -1));
      local_38 = (int *)(dVar4 + (double)local_38);
    }
    n_local = local_38;
  }
  else {
    iVar1 = *n;
    iVar2 = *incx;
    stemp._4_4_ = 1;
    while( true ) {
      if (*incx < 0) {
        bVar3 = iVar1 * iVar2 <= stemp._4_4_;
      }
      else {
        bVar3 = stemp._4_4_ <= iVar1 * iVar2;
      }
      if (!bVar3) break;
      dVar4 = z_abs(cx + (stemp._4_4_ + -1));
      local_38 = (int *)(dVar4 + (double)local_38);
      stemp._4_4_ = *incx + stemp._4_4_;
    }
    n_local = local_38;
  }
  return (double)n_local;
}

Assistant:

double dzsum1_slu(int *n, doublecomplex *cx, int *incx)
{

    /* Builtin functions */
    double z_abs(doublecomplex *);
    
    /* Local variables */
    int i, nincx;
    double stemp;


#define CX(I) cx[(I)-1]

    stemp = 0.;
    if (*n <= 0) {
	return stemp;
    }
    if (*incx == 1) {
	goto L20;
    }

    /*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L10: */
    }
    
    return stemp;

    /*     CODE FOR INCREMENT EQUAL TO 1 */

L20:
    for (i = 1; i <= *n; ++i) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L30: */
    }
    
    return stemp;

    /*     End of DZSUM1 */

}